

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::DuplicateRowsPS::execute
          (DuplicateRowsPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *param_1,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *y,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *param_4,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  undefined8 *puVar2;
  pointer pnVar3;
  undefined8 uVar4;
  byte bVar5;
  int32_t iVar6;
  int iVar7;
  int iVar8;
  VarStatus *pVVar9;
  cpp_dec_float<200U,_int,_void> *pcVar10;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar11;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar12;
  long lVar13;
  VarStatus *pVVar14;
  VarStatus VVar15;
  long lVar16;
  cpp_dec_float<200U,_int,_void> *pcVar17;
  uint *puVar18;
  uint *puVar19;
  undefined4 *puVar20;
  cpp_dec_float<200U,_int,_void> *pcVar21;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar22;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar23;
  uint *puVar24;
  cpp_dec_float<200U,_int,_void> *pcVar25;
  pointer pnVar26;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar27;
  ulong uVar28;
  long lVar29;
  byte bVar30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  undefined1 local_138 [128];
  cpp_dec_float<200U,_int,_void> local_b8;
  
  bVar30 = 0;
  if ((this->m_isLast == true) && (lVar16 = (long)(this->m_perm).thesize, 0 < lVar16)) {
    uVar28 = lVar16 + 1;
    lVar16 = lVar16 * 0x20 + -2;
    do {
      lVar29 = (long)(this->m_perm).data[uVar28 - 2];
      if (-1 < lVar29) {
        pnVar3 = (s->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar2 = (undefined8 *)((long)&(pnVar3->m_backend).data + lVar16 * 4);
        puVar18 = (uint *)(pnVar3 + lVar29);
        puVar19 = (uint *)(puVar2 + -0xf);
        for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
          *puVar19 = *puVar18;
          puVar18 = puVar18 + 1;
          puVar19 = puVar19 + 1;
        }
        *(int *)(puVar2 + -1) = pnVar3[lVar29].m_backend.exp;
        *(bool *)((long)puVar2 + -4) = pnVar3[lVar29].m_backend.neg;
        *puVar2 = *(undefined8 *)&pnVar3[lVar29].m_backend.fpclass;
        pnVar3 = (y->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar18 = (uint *)((long)&(pnVar3->m_backend).data + lVar16 * 4 + -0x78);
        puVar19 = (uint *)(pnVar3 + lVar29);
        puVar24 = puVar18;
        for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
          *puVar24 = *puVar19;
          puVar19 = puVar19 + 1;
          puVar24 = puVar24 + 1;
        }
        puVar18[0x1c] = pnVar3[lVar29].m_backend.exp;
        *(bool *)(puVar18 + 0x1d) = pnVar3[lVar29].m_backend.neg;
        iVar6 = pnVar3[lVar29].m_backend.prec_elem;
        puVar18[0x1e] = pnVar3[lVar29].m_backend.fpclass;
        puVar18[0x1f] = iVar6;
        rStatus->data[uVar28 - 2] = rStatus->data[lVar29];
      }
      uVar28 = uVar28 - 1;
      lVar16 = lVar16 + -0x20;
    } while (1 < uVar28);
  }
  iVar7 = (this->m_scale).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused;
  if (0 < iVar7) {
    lVar29 = 0;
    lVar16 = 0;
    do {
      pNVar11 = (this->m_scale).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .m_elem;
      if (*(int *)((long)(&pNVar11->val + 1) + lVar29) != this->m_i) {
        local_b8.fpclass = cpp_dec_float_finite;
        local_b8.prec_elem = 0x1c;
        local_b8.data._M_elems[0] = 0;
        local_b8.data._M_elems[1] = 0;
        local_b8.data._M_elems[2] = 0;
        local_b8.data._M_elems[3] = 0;
        local_b8.data._M_elems[4] = 0;
        local_b8.data._M_elems[5] = 0;
        local_b8.data._M_elems[6] = 0;
        local_b8.data._M_elems[7] = 0;
        local_b8.data._M_elems[8] = 0;
        local_b8.data._M_elems[9] = 0;
        local_b8.data._M_elems[10] = 0;
        local_b8.data._M_elems[0xb] = 0;
        local_b8.data._M_elems[0xc] = 0;
        local_b8.data._M_elems[0xd] = 0;
        local_b8.data._M_elems[0xe] = 0;
        local_b8.data._M_elems[0xf] = 0;
        local_b8.data._M_elems[0x10] = 0;
        local_b8.data._M_elems[0x11] = 0;
        local_b8.data._M_elems[0x12] = 0;
        local_b8.data._M_elems[0x13] = 0;
        local_b8.data._M_elems[0x14] = 0;
        local_b8.data._M_elems[0x15] = 0;
        local_b8.data._M_elems[0x16] = 0;
        local_b8.data._M_elems[0x17] = 0;
        local_b8.data._M_elems[0x18] = 0;
        local_b8.data._M_elems[0x19] = 0;
        local_b8.data._M_elems._104_5_ = 0;
        local_b8.data._M_elems[0x1b]._1_3_ = 0;
        local_b8.exp = 0;
        local_b8.neg = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&local_b8,
                   &(s->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[this->m_i].m_backend,
                   (cpp_dec_float<200U,_int,_void> *)
                   ((long)(pNVar11->val).m_backend.data._M_elems + lVar29));
        iVar7 = *(int *)((long)(&((this->m_scale).
                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .m_elem)->val + 1) + lVar29);
        pnVar3 = (s->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar10 = &local_b8;
        pnVar26 = pnVar3 + iVar7;
        for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
          (pnVar26->m_backend).data._M_elems[0] = (pcVar10->data)._M_elems[0];
          pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar30 * -8 + 4);
          pnVar26 = (pointer)((long)pnVar26 + ((ulong)bVar30 * -2 + 1) * 4);
        }
        pnVar3[iVar7].m_backend.exp = local_b8.exp;
        pnVar3[iVar7].m_backend.neg = local_b8.neg;
        pnVar3[iVar7].m_backend.fpclass = local_b8.fpclass;
        pnVar3[iVar7].m_backend.prec_elem = local_b8.prec_elem;
        iVar7 = (this->m_scale).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .memused;
      }
      lVar16 = lVar16 + 1;
      lVar29 = lVar29 + 0x84;
    } while (lVar16 < iVar7);
    if (0 < iVar7) {
      pnVar1 = &this->m_i_rowObj;
      pVVar14 = rStatus->data;
      lVar16 = 0;
      lVar29 = 0;
      bVar5 = 0;
      do {
        pNVar11 = (this->m_scale).
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .m_elem;
        iVar7 = *(int *)((long)(&pNVar11->val + 1) + lVar16);
        iVar8 = this->m_i;
        VVar15 = pVVar14[iVar8];
        if ((VVar15 == BASIC) || ((bool)(iVar7 != iVar8 & bVar5))) {
LAB_0057fb81:
          pNVar11 = (this->m_rowObj).
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .m_elem;
          pnVar3 = (y->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar20 = (undefined4 *)((long)(pNVar11->val).m_backend.data._M_elems + lVar16);
          pnVar26 = pnVar3 + iVar7;
          for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
            (pnVar26->m_backend).data._M_elems[0] = *puVar20;
            puVar20 = puVar20 + (ulong)bVar30 * -2 + 1;
            pnVar26 = (pointer)((long)pnVar26 + ((ulong)bVar30 * -2 + 1) * 4);
          }
          pnVar3[iVar7].m_backend.exp =
               *(int *)((long)(&(pNVar11->val).m_backend.data + 1) + lVar16);
          pnVar3[iVar7].m_backend.neg =
               *(bool *)((long)(&(pNVar11->val).m_backend.data + 1) + lVar16 + 4);
          uVar4 = *(undefined8 *)((long)(&(pNVar11->val).m_backend.data + 1) + lVar16 + 8);
          pnVar3[iVar7].m_backend.fpclass = (int)uVar4;
          pnVar3[iVar7].m_backend.prec_elem = (int)((ulong)uVar4 >> 0x20);
          pVVar14 = rStatus->data;
          pVVar9 = pVVar14 + iVar7;
LAB_0057fbcf:
          *pVVar9 = BASIC;
        }
        else if (VVar15 == FIXED) {
          if ((iVar7 == this->m_maxLhsIdx) || (iVar7 == this->m_minRhsIdx)) {
            pcVar17 = &(y->val).
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar8].m_backend;
            pcVar21 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)(pNVar11->val).m_backend.data._M_elems + lVar16);
            local_b8.fpclass = cpp_dec_float_finite;
            local_b8.prec_elem = 0x1c;
            local_b8.data._M_elems[0] = 0;
            local_b8.data._M_elems[1] = 0;
            local_b8.data._M_elems[2] = 0;
            local_b8.data._M_elems[3] = 0;
            local_b8.data._M_elems[4] = 0;
            local_b8.data._M_elems[5] = 0;
            local_b8.data._M_elems[6] = 0;
            local_b8.data._M_elems[7] = 0;
            local_b8.data._M_elems[8] = 0;
            local_b8.data._M_elems[9] = 0;
            local_b8.data._M_elems[10] = 0;
            local_b8.data._M_elems[0xb] = 0;
            local_b8.data._M_elems[0xc] = 0;
            local_b8.data._M_elems[0xd] = 0;
            local_b8.data._M_elems[0xe] = 0;
            local_b8.data._M_elems[0xf] = 0;
            local_b8.data._M_elems[0x10] = 0;
            local_b8.data._M_elems[0x11] = 0;
            local_b8.data._M_elems[0x12] = 0;
            local_b8.data._M_elems[0x13] = 0;
            local_b8.data._M_elems[0x14] = 0;
            local_b8.data._M_elems[0x15] = 0;
            local_b8.data._M_elems[0x16] = 0;
            local_b8.data._M_elems[0x17] = 0;
            local_b8.data._M_elems[0x18] = 0;
            local_b8.data._M_elems[0x19] = 0;
            local_b8.data._M_elems._104_5_ = 0;
            local_b8.data._M_elems[0x1b]._1_3_ = 0;
            local_b8.exp = 0;
            local_b8.neg = false;
            pcVar10 = pcVar17;
            if ((pcVar21 != &local_b8) && (pcVar10 = pcVar21, &local_b8 != pcVar17)) {
              pcVar21 = pcVar17;
              pcVar25 = &local_b8;
              for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                (pcVar25->data)._M_elems[0] = (pcVar21->data)._M_elems[0];
                pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar30 * -8 + 4)
                ;
                pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar30 * -8 + 4)
                ;
              }
              local_b8.exp = pcVar17->exp;
              local_b8.neg = pcVar17->neg;
              local_b8.fpclass = pcVar17->fpclass;
              local_b8.prec_elem = pcVar17->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      (&local_b8,pcVar10);
            pnVar3 = (y->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pcVar10 = &local_b8;
            pnVar26 = pnVar3 + iVar7;
            for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
              (pnVar26->m_backend).data._M_elems[0] = (pcVar10->data)._M_elems[0];
              pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar30 * -8 + 4);
              pnVar26 = (pointer)((long)pnVar26 + ((ulong)bVar30 * -2 + 1) * 4);
            }
            pnVar3[iVar7].m_backend.exp = local_b8.exp;
            pnVar3[iVar7].m_backend.neg = local_b8.neg;
            pnVar3[iVar7].m_backend.fpclass = local_b8.fpclass;
            pnVar3[iVar7].m_backend.prec_elem = local_b8.prec_elem;
            iVar8 = this->m_i;
            pnVar3 = (y->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pnVar22 = pnVar1;
            pnVar26 = pnVar3 + iVar8;
            for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
              (pnVar26->m_backend).data._M_elems[0] = (pnVar22->m_backend).data._M_elems[0];
              pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar22 + (ulong)bVar30 * -8 + 4);
              pnVar26 = (pointer)((long)pnVar26 + ((ulong)bVar30 * -2 + 1) * 4);
            }
            pnVar3[iVar8].m_backend.exp = (this->m_i_rowObj).m_backend.exp;
            pnVar3[iVar8].m_backend.neg = (this->m_i_rowObj).m_backend.neg;
            iVar6 = (this->m_i_rowObj).m_backend.prec_elem;
            pnVar3[iVar8].m_backend.fpclass = (this->m_i_rowObj).m_backend.fpclass;
            pnVar3[iVar8].m_backend.prec_elem = iVar6;
            if ((this->m_isLhsEqualRhs).data[lVar29] != true) {
              if (iVar7 != this->m_maxLhsIdx) {
                pNVar11 = (this->m_scale).
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .m_elem;
                goto LAB_005801c6;
              }
              pNVar11 = (this->m_scale).
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .m_elem;
              goto LAB_00580020;
            }
            pVVar14 = rStatus->data;
            pVVar14[iVar7] = FIXED;
            goto LAB_0058024d;
          }
LAB_0057fc15:
          if (iVar7 != iVar8) goto LAB_0057fb81;
        }
        else {
          if ((VVar15 == ON_LOWER) && (iVar7 == this->m_maxLhsIdx)) {
            pcVar17 = &(y->val).
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar8].m_backend;
            pcVar21 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)(pNVar11->val).m_backend.data._M_elems + lVar16);
            local_b8.fpclass = cpp_dec_float_finite;
            local_b8.prec_elem = 0x1c;
            local_b8.data._M_elems[0] = 0;
            local_b8.data._M_elems[1] = 0;
            local_b8.data._M_elems[2] = 0;
            local_b8.data._M_elems[3] = 0;
            local_b8.data._M_elems[4] = 0;
            local_b8.data._M_elems[5] = 0;
            local_b8.data._M_elems[6] = 0;
            local_b8.data._M_elems[7] = 0;
            local_b8.data._M_elems[8] = 0;
            local_b8.data._M_elems[9] = 0;
            local_b8.data._M_elems[10] = 0;
            local_b8.data._M_elems[0xb] = 0;
            local_b8.data._M_elems[0xc] = 0;
            local_b8.data._M_elems[0xd] = 0;
            local_b8.data._M_elems[0xe] = 0;
            local_b8.data._M_elems[0xf] = 0;
            local_b8.data._M_elems[0x10] = 0;
            local_b8.data._M_elems[0x11] = 0;
            local_b8.data._M_elems[0x12] = 0;
            local_b8.data._M_elems[0x13] = 0;
            local_b8.data._M_elems[0x14] = 0;
            local_b8.data._M_elems[0x15] = 0;
            local_b8.data._M_elems[0x16] = 0;
            local_b8.data._M_elems[0x17] = 0;
            local_b8.data._M_elems[0x18] = 0;
            local_b8.data._M_elems[0x19] = 0;
            local_b8.data._M_elems._104_5_ = 0;
            local_b8.data._M_elems[0x1b]._1_3_ = 0;
            local_b8.exp = 0;
            local_b8.neg = false;
            pcVar10 = pcVar17;
            if ((pcVar21 != &local_b8) && (pcVar10 = pcVar21, &local_b8 != pcVar17)) {
              pcVar21 = pcVar17;
              pcVar25 = &local_b8;
              for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                (pcVar25->data)._M_elems[0] = (pcVar21->data)._M_elems[0];
                pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar30 * -8 + 4)
                ;
                pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar30 * -8 + 4)
                ;
              }
              local_b8.exp = pcVar17->exp;
              local_b8.neg = pcVar17->neg;
              local_b8.fpclass = pcVar17->fpclass;
              local_b8.prec_elem = pcVar17->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      (&local_b8,pcVar10);
            pnVar3 = (y->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pcVar10 = &local_b8;
            pnVar26 = pnVar3 + iVar7;
            for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
              (pnVar26->m_backend).data._M_elems[0] = (pcVar10->data)._M_elems[0];
              pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar30 * -8 + 4);
              pnVar26 = (pointer)((long)pnVar26 + ((ulong)bVar30 * -2 + 1) * 4);
            }
            pnVar3[iVar7].m_backend.exp = local_b8.exp;
            pnVar3[iVar7].m_backend.neg = local_b8.neg;
            pnVar3[iVar7].m_backend.fpclass = local_b8.fpclass;
            pnVar3[iVar7].m_backend.prec_elem = local_b8.prec_elem;
            iVar8 = this->m_i;
            pnVar3 = (y->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pnVar22 = pnVar1;
            pnVar26 = pnVar3 + iVar8;
            for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
              (pnVar26->m_backend).data._M_elems[0] = (pnVar22->m_backend).data._M_elems[0];
              pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar22 + (ulong)bVar30 * -8 + 4);
              pnVar26 = (pointer)((long)pnVar26 + ((ulong)bVar30 * -2 + 1) * 4);
            }
            pnVar3[iVar8].m_backend.exp = (this->m_i_rowObj).m_backend.exp;
            pnVar3[iVar8].m_backend.neg = (this->m_i_rowObj).m_backend.neg;
            iVar6 = (this->m_i_rowObj).m_backend.prec_elem;
            pnVar3[iVar8].m_backend.fpclass = (this->m_i_rowObj).m_backend.fpclass;
            pnVar3[iVar8].m_backend.prec_elem = iVar6;
            pNVar11 = (this->m_scale).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .m_elem;
LAB_00580020:
            local_138._120_4_ = cpp_dec_float_finite;
            local_138._124_4_ = 0x1c;
            local_138[0x74] = false;
            local_138._112_4_ = 0;
            local_138._109_3_ = 0;
            local_138._104_5_ = 0;
            local_138._96_4_ = 0;
            local_138._100_4_ = 0;
            local_138._88_4_ = 0;
            local_138._92_4_ = 0;
            local_138._80_4_ = 0;
            local_138._84_4_ = 0;
            local_138._72_4_ = 0;
            local_138._76_4_ = 0;
            local_138._64_4_ = 0;
            local_138._68_4_ = 0;
            local_138._56_4_ = 0;
            local_138._60_4_ = 0;
            local_138._48_4_ = 0;
            local_138._52_4_ = 0;
            local_138._40_4_ = 0;
            local_138._44_4_ = 0;
            local_138._32_4_ = 0;
            local_138._36_4_ = 0;
            local_138._24_4_ = 0;
            local_138._28_4_ = 0;
            local_138._16_4_ = 0;
            local_138._20_4_ = 0;
            local_138._8_4_ = 0;
            local_138._12_4_ = 0;
            local_138._0_4_ = 0;
            local_138._4_4_ = 0;
            pNVar23 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)((long)(pNVar11->val).m_backend.data._M_elems + lVar16);
            pNVar12 = pNVar23;
            if (((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)local_138 != pNVar11) &&
               (pNVar12 = pNVar11,
               pNVar23 !=
               (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)local_138)) {
              pNVar27 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)local_138;
              for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                (pNVar27->val).m_backend.data._M_elems[0] =
                     (pNVar23->val).m_backend.data._M_elems[0];
                pNVar23 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)((long)pNVar23 + (ulong)bVar30 * -8 + 4);
                pNVar27 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)((long)pNVar27 + (ulong)bVar30 * -8 + 4);
              }
              local_138._112_4_ = *(int *)((long)(&(pNVar11->val).m_backend.data + 1) + lVar16);
              local_138[0x74] =
                   *(undefined1 *)((long)(&(pNVar11->val).m_backend.data + 1) + lVar16 + 4);
              local_138._120_8_ =
                   *(undefined8 *)((long)(&(pNVar11->val).m_backend.data + 1) + lVar16 + 8);
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      ((cpp_dec_float<200U,_int,_void> *)local_138,
                       (cpp_dec_float<200U,_int,_void> *)pNVar12);
            VVar15 = ON_UPPER;
            if (local_138._120_4_ != cpp_dec_float_NaN) {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>(&local_b8,0,(type *)0x0);
              iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                ((cpp_dec_float<200U,_int,_void> *)local_138,&local_b8);
              VVar15 = (VarStatus)(0 < iVar8);
            }
          }
          else {
            if ((VVar15 != ON_UPPER) || (iVar7 != this->m_minRhsIdx)) goto LAB_0057fc15;
            pcVar17 = &(y->val).
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar8].m_backend;
            pcVar21 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)(pNVar11->val).m_backend.data._M_elems + lVar16);
            local_b8.fpclass = cpp_dec_float_finite;
            local_b8.prec_elem = 0x1c;
            local_b8.data._M_elems[0] = 0;
            local_b8.data._M_elems[1] = 0;
            local_b8.data._M_elems[2] = 0;
            local_b8.data._M_elems[3] = 0;
            local_b8.data._M_elems[4] = 0;
            local_b8.data._M_elems[5] = 0;
            local_b8.data._M_elems[6] = 0;
            local_b8.data._M_elems[7] = 0;
            local_b8.data._M_elems[8] = 0;
            local_b8.data._M_elems[9] = 0;
            local_b8.data._M_elems[10] = 0;
            local_b8.data._M_elems[0xb] = 0;
            local_b8.data._M_elems[0xc] = 0;
            local_b8.data._M_elems[0xd] = 0;
            local_b8.data._M_elems[0xe] = 0;
            local_b8.data._M_elems[0xf] = 0;
            local_b8.data._M_elems[0x10] = 0;
            local_b8.data._M_elems[0x11] = 0;
            local_b8.data._M_elems[0x12] = 0;
            local_b8.data._M_elems[0x13] = 0;
            local_b8.data._M_elems[0x14] = 0;
            local_b8.data._M_elems[0x15] = 0;
            local_b8.data._M_elems[0x16] = 0;
            local_b8.data._M_elems[0x17] = 0;
            local_b8.data._M_elems[0x18] = 0;
            local_b8.data._M_elems[0x19] = 0;
            local_b8.data._M_elems._104_5_ = 0;
            local_b8.data._M_elems[0x1b]._1_3_ = 0;
            local_b8.exp = 0;
            local_b8.neg = false;
            pcVar10 = pcVar17;
            if ((pcVar21 != &local_b8) && (pcVar10 = pcVar21, &local_b8 != pcVar17)) {
              pcVar21 = pcVar17;
              pcVar25 = &local_b8;
              for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                (pcVar25->data)._M_elems[0] = (pcVar21->data)._M_elems[0];
                pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar30 * -8 + 4)
                ;
                pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar30 * -8 + 4)
                ;
              }
              local_b8.exp = pcVar17->exp;
              local_b8.neg = pcVar17->neg;
              local_b8.fpclass = pcVar17->fpclass;
              local_b8.prec_elem = pcVar17->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      (&local_b8,pcVar10);
            pnVar3 = (y->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pcVar10 = &local_b8;
            pnVar26 = pnVar3 + iVar7;
            for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
              (pnVar26->m_backend).data._M_elems[0] = (pcVar10->data)._M_elems[0];
              pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar30 * -8 + 4);
              pnVar26 = (pointer)((long)pnVar26 + ((ulong)bVar30 * -2 + 1) * 4);
            }
            pnVar3[iVar7].m_backend.exp = local_b8.exp;
            pnVar3[iVar7].m_backend.neg = local_b8.neg;
            pnVar3[iVar7].m_backend.fpclass = local_b8.fpclass;
            pnVar3[iVar7].m_backend.prec_elem = local_b8.prec_elem;
            iVar8 = this->m_i;
            pnVar3 = (y->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pnVar22 = pnVar1;
            pnVar26 = pnVar3 + iVar8;
            for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
              (pnVar26->m_backend).data._M_elems[0] = (pnVar22->m_backend).data._M_elems[0];
              pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar22 + (ulong)bVar30 * -8 + 4);
              pnVar26 = (pointer)((long)pnVar26 + ((ulong)bVar30 * -2 + 1) * 4);
            }
            pnVar3[iVar8].m_backend.exp = (this->m_i_rowObj).m_backend.exp;
            pnVar3[iVar8].m_backend.neg = (this->m_i_rowObj).m_backend.neg;
            iVar6 = (this->m_i_rowObj).m_backend.prec_elem;
            pnVar3[iVar8].m_backend.fpclass = (this->m_i_rowObj).m_backend.fpclass;
            pnVar3[iVar8].m_backend.prec_elem = iVar6;
            pNVar11 = (this->m_scale).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .m_elem;
LAB_005801c6:
            local_138._120_4_ = cpp_dec_float_finite;
            local_138._124_4_ = 0x1c;
            local_138[0x74] = false;
            local_138._112_4_ = 0;
            local_138._109_3_ = 0;
            local_138._104_5_ = 0;
            local_138._96_4_ = 0;
            local_138._100_4_ = 0;
            local_138._88_4_ = 0;
            local_138._92_4_ = 0;
            local_138._80_4_ = 0;
            local_138._84_4_ = 0;
            local_138._72_4_ = 0;
            local_138._76_4_ = 0;
            local_138._64_4_ = 0;
            local_138._68_4_ = 0;
            local_138._56_4_ = 0;
            local_138._60_4_ = 0;
            local_138._48_4_ = 0;
            local_138._52_4_ = 0;
            local_138._40_4_ = 0;
            local_138._44_4_ = 0;
            local_138._32_4_ = 0;
            local_138._36_4_ = 0;
            local_138._24_4_ = 0;
            local_138._28_4_ = 0;
            local_138._16_4_ = 0;
            local_138._20_4_ = 0;
            local_138._8_4_ = 0;
            local_138._12_4_ = 0;
            local_138._0_4_ = 0;
            local_138._4_4_ = 0;
            pNVar23 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)((long)(pNVar11->val).m_backend.data._M_elems + lVar16);
            pNVar12 = pNVar23;
            if (((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)local_138 != pNVar11) &&
               (pNVar12 = pNVar11,
               pNVar23 !=
               (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)local_138)) {
              pNVar27 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)local_138;
              for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                (pNVar27->val).m_backend.data._M_elems[0] =
                     (pNVar23->val).m_backend.data._M_elems[0];
                pNVar23 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)((long)pNVar23 + (ulong)bVar30 * -8 + 4);
                pNVar27 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)((long)pNVar27 + (ulong)bVar30 * -8 + 4);
              }
              local_138._112_4_ = *(int *)((long)(&(pNVar11->val).m_backend.data + 1) + lVar16);
              local_138[0x74] =
                   *(undefined1 *)((long)(&(pNVar11->val).m_backend.data + 1) + lVar16 + 4);
              local_138._120_8_ =
                   *(undefined8 *)((long)(&(pNVar11->val).m_backend.data + 1) + lVar16 + 8);
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      ((cpp_dec_float<200U,_int,_void> *)local_138,
                       (cpp_dec_float<200U,_int,_void> *)pNVar12);
            VVar15 = ON_LOWER;
            if (local_138._120_4_ != cpp_dec_float_NaN) {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>(&local_b8,0,(type *)0x0);
              iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                ((cpp_dec_float<200U,_int,_void> *)local_138,&local_b8);
              VVar15 = (VarStatus)(iVar8 < 1);
            }
          }
          pVVar14 = rStatus->data;
          pVVar14[iVar7] = VVar15;
LAB_0058024d:
          bVar5 = 1;
          if (iVar7 != this->m_i) {
            pVVar9 = pVVar14 + this->m_i;
            bVar5 = 1;
            goto LAB_0057fbcf;
          }
        }
        lVar29 = lVar29 + 1;
        lVar16 = lVar16 + 0x84;
      } while (lVar29 < (this->m_scale).
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .memused);
    }
  }
  return;
}

Assistant:

void SPxMainSM<R>::DuplicateRowsPS::execute(VectorBase<R>&, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>&,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the duplicated rows:
   if(m_isLast)
   {
      for(int i = m_perm.size() - 1; i >= 0; --i)
      {
         if(m_perm[i] >= 0)
         {
            int rIdx_new = m_perm[i];
            int rIdx = i;
            s[rIdx] = s[rIdx_new];
            y[rIdx] = y[rIdx_new];
            rStatus[rIdx] = rStatus[rIdx_new];
         }
      }
   }

   // primal:
   for(int k = 0; k < m_scale.size(); ++k)
   {
      if(m_scale.index(k) != m_i)
         s[m_scale.index(k)] = s[m_i] / m_scale.value(k);
   }

   // dual & basis:
   bool haveSetBasis = false;

   for(int k = 0; k < m_scale.size(); ++k)
   {
      int i = m_scale.index(k);

      if(rStatus[m_i] == SPxSolverBase<R>::BASIC || (haveSetBasis && i != m_i))
         // if the row with tightest lower and upper bound in the basic, every duplicate row should in basic
         // or basis status of row m_i has been set, this row should be in basis
      {
         y[i]       = m_rowObj.value(k);
         rStatus[i] = SPxSolverBase<R>::BASIC;
         continue;
      }

      SOPLEX_ASSERT_WARN("WMAISM02", isNotZero(m_scale.value(k), this->epsilon()));

      if(rStatus[m_i] == SPxSolverBase<R>::FIXED && (i == m_maxLhsIdx || i == m_minRhsIdx))
      {
         // this row leads to the tightest lower or upper bound, slack should not be in the basis
         y[i]   = y[m_i] * m_scale.value(k);
         y[m_i] = m_i_rowObj;

         if(m_isLhsEqualRhs[k])
         {
            rStatus[i] = SPxSolverBase<R>::FIXED;
         }
         else if(i == m_maxLhsIdx)
         {
            rStatus[i] = m_scale.value(k) * m_scale.value(0) > 0 ? SPxSolverBase<R>::ON_LOWER :
                         SPxSolverBase<R>::ON_UPPER;
         }
         else
         {
            assert(i == m_minRhsIdx);

            rStatus[i] = m_scale.value(k) * m_scale.value(0) > 0 ? SPxSolverBase<R>::ON_UPPER :
                         SPxSolverBase<R>::ON_LOWER;
         }

         if(i != m_i)
            rStatus[m_i] = SPxSolverBase<R>::BASIC;

         haveSetBasis = true;
      }
      else if(i == m_maxLhsIdx && rStatus[m_i] == SPxSolverBase<R>::ON_LOWER)
      {
         // this row leads to the tightest lower bound, slack should not be in the basis
         y[i]   = y[m_i] * m_scale.value(k);
         y[m_i] = m_i_rowObj;

         rStatus[i] = m_scale.value(k) * m_scale.value(0) > 0 ? SPxSolverBase<R>::ON_LOWER :
                      SPxSolverBase<R>::ON_UPPER;

         if(i != m_i)
            rStatus[m_i] = SPxSolverBase<R>::BASIC;

         haveSetBasis = true;
      }
      else if(i == m_minRhsIdx && rStatus[m_i] == SPxSolverBase<R>::ON_UPPER)
      {
         // this row leads to the tightest upper bound, slack should not be in the basis
         y[i]   = y[m_i] * m_scale.value(k);
         y[m_i] = m_i_rowObj;

         rStatus[i] = m_scale.value(k) * m_scale.value(0) > 0 ? SPxSolverBase<R>::ON_UPPER :
                      SPxSolverBase<R>::ON_LOWER;

         if(i != m_i)
            rStatus[m_i] = SPxSolverBase<R>::BASIC;

         haveSetBasis = true;
      }
      else if(i != m_i)
      {
         // this row does not lead to the tightest lower or upper bound, slack should be in the basis
         y[i]       = m_rowObj.value(k);
         rStatus[i] = SPxSolverBase<R>::BASIC;
      }
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(m_isFirst && !this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM24 Dimension doesn't match after this step.");
   }

#endif

   // nothing to do for the reduced cost values
}